

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmartPtr.hpp
# Opt level: O0

SmartPtr<Kernel::Ordering> * __thiscall
Lib::SmartPtr<Kernel::Ordering>::operator=
          (SmartPtr<Kernel::Ordering> *this,SmartPtr<Kernel::Ordering> *ptr)

{
  Ordering *pOVar1;
  RefCounter *ptr_00;
  undefined8 *in_RSI;
  SmartPtr<Kernel::Ordering> *in_RDI;
  RefCounter *oldCnt;
  Ordering *oldObj;
  size_t in_stack_ffffffffffffffc8;
  Ordering *in_stack_ffffffffffffffd0;
  
  pOVar1 = in_RDI->_obj;
  ptr_00 = in_RDI->_refCnt;
  in_RDI->_obj = (Ordering *)*in_RSI;
  in_RDI->_refCnt = (RefCounter *)in_RSI[1];
  if ((in_RDI->_obj != (Ordering *)0x0) && (in_RDI->_refCnt != (RefCounter *)0x0)) {
    in_RDI->_refCnt->_val = in_RDI->_refCnt->_val + 1;
  }
  if ((((pOVar1 != (Ordering *)0x0) && (ptr_00 != (RefCounter *)0x0)) &&
      (ptr_00->_val = ptr_00->_val + -1, ptr_00->_val == 0)) &&
     (checked_delete<Kernel::Ordering>(in_stack_ffffffffffffffd0), ptr_00 != (RefCounter *)0x0)) {
    RefCounter::operator_delete(ptr_00,in_stack_ffffffffffffffc8);
  }
  return in_RDI;
}

Assistant:

SmartPtr& operator=(const SmartPtr& ptr)
  {
    T* oldObj=_obj;
    RefCounter* oldCnt=_refCnt;
    _obj=ptr._obj;
    _refCnt=ptr._refCnt;

    if(_obj && _refCnt) {
      (_refCnt->_val)++;
    }

    if(oldObj && oldCnt) {
      (oldCnt->_val)--;
      ASS(oldCnt->_val >= 0);
      if(! oldCnt->_val) {
        checked_delete(oldObj);
        delete oldCnt;
      }
    }
    return *this;
  }